

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.c
# Opt level: O2

ZyanBool ZydisCheckOsz(ZydisEncoderInstructionMatch *match,ZydisRegisterWidth reg_width)

{
  if (0xff < reg_width) {
    __assert_fail("reg_width <= (255)",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                  ,0x29d,
                  "ZyanBool ZydisCheckOsz(ZydisEncoderInstructionMatch *, ZydisRegisterWidth)");
  }
  if (match->eosz != 0) {
    return match->eosz == reg_width;
  }
  if (reg_width == 8) {
    return '\0';
  }
  match->eosz = (ZyanU8)reg_width;
  return '\x01';
}

Assistant:

static ZyanBool ZydisCheckOsz(ZydisEncoderInstructionMatch *match, ZydisRegisterWidth reg_width)
{
    ZYAN_ASSERT(reg_width <= ZYAN_UINT8_MAX);
    if (match->eosz == 0)
    {
        if (reg_width == 8)
        {
            return ZYAN_FALSE;
        }
        match->eosz = (ZyanU8)reg_width;
        return ZYAN_TRUE;
    }

    return match->eosz == (ZyanU8)reg_width ? ZYAN_TRUE : ZYAN_FALSE;
}